

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineResourceSignatureVkImpl.cpp
# Opt level: O0

void __thiscall
Diligent::PipelineResourceSignatureVkImpl::CopyStaticResources
          (PipelineResourceSignatureVkImpl *this,ShaderResourceCacheVk *DstResourceCache)

{
  ushort uVar1;
  ShaderResourceCacheVk *this_00;
  undefined *puVar2;
  bool bVar3;
  ResourceCacheContentType CacheType;
  ResourceCacheContentType CacheType_00;
  Uint32 Index;
  Uint32 UVar4;
  DescriptorSet *this_01;
  DescriptorSet *this_02;
  pair<unsigned_int,_unsigned_int> pVar5;
  PipelineResourceDesc *ResDesc_00;
  Char *pCVar6;
  Resource *pRVar7;
  undefined8 uVar8;
  RenderDeviceVkImpl *this_03;
  VulkanLogicalDevice *pLogicalDevice;
  PipelineResourceDesc *in_RCX;
  char (*in_stack_fffffffffffffe38) [3];
  RefCntAutoPtr<Diligent::IDeviceObject> local_160;
  SetResourceInfo local_158;
  undefined1 local_138 [8];
  string msg_2;
  IDeviceObject *pCachedResource;
  string msg_1;
  Resource *DstCachedRes;
  undefined1 local_e0 [4];
  Uint32 DstCacheOffset;
  undefined1 local_c0 [8];
  string _msg;
  IDeviceObject *pObject;
  Resource *SrcCachedRes;
  uint local_88;
  Uint32 SrcCacheOffset;
  Uint32 ArrInd;
  undefined1 local_78 [8];
  string msg;
  PipelineResourceAttribsType *Attr;
  PipelineResourceDesc *ResDesc;
  Uint32 r;
  ResourceCacheContentType DstCacheType;
  uint uStack_3c;
  ResourceCacheContentType SrcCacheType;
  pair<unsigned_int,_unsigned_int> ResIdxRange;
  DescriptorSet *DstDescrSet;
  DescriptorSet *SrcDescrSet;
  Uint32 StaticSetIdx;
  ShaderResourceCacheImplType *SrcResourceCache;
  ShaderResourceCacheVk *DstResourceCache_local;
  PipelineResourceSignatureVkImpl *this_local;
  
  bVar3 = HasDescriptorSet(this,DESCRIPTOR_SET_ID_STATIC_MUTABLE);
  if ((bVar3) &&
     ((this->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>).m_pStaticResCache !=
      (ShaderResourceCacheImplType *)0x0)) {
    this_00 = (this->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>).
              m_pStaticResCache;
    Index = GetDescriptorSetIndex<(Diligent::PipelineResourceSignatureVkImpl::DESCRIPTOR_SET_ID)0>
                      (this);
    this_01 = ShaderResourceCacheVk::GetDescriptorSet(this_00,Index);
    this_02 = ShaderResourceCacheVk::GetDescriptorSet(DstResourceCache,Index);
    pVar5 = PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>::GetResourceIndexRange
                      (&this->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>,
                       SHADER_RESOURCE_VARIABLE_TYPE_STATIC);
    CacheType = ShaderResourceCacheVk::GetContentType(this_00);
    CacheType_00 = ShaderResourceCacheVk::GetContentType(DstResourceCache);
    r = pVar5.first;
    for (ResDesc._0_4_ = r; uStack_3c = pVar5.second, (uint)ResDesc < uStack_3c;
        ResDesc._0_4_ = (uint)ResDesc + 1) {
      ResDesc_00 = PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>::GetResourceDesc
                             (&this->
                               super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>,
                              (uint)ResDesc);
      msg.field_2._8_8_ =
           PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>::GetResourceAttribs
                     (&this->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>,
                      (uint)ResDesc);
      if (ResDesc_00->VarType != SHADER_RESOURCE_VARIABLE_TYPE_STATIC) {
        FormatString<char[26],char[56]>
                  ((string *)local_78,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"ResDesc.VarType == SHADER_RESOURCE_VARIABLE_TYPE_STATIC",
                   (char (*) [56])in_RCX);
        pCVar6 = (Char *)std::__cxx11::string::c_str();
        in_RCX = (PipelineResourceDesc *)0x227;
        DebugAssertionFailed
                  (pCVar6,"CopyStaticResources",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineResourceSignatureVkImpl.cpp"
                   ,0x227);
        std::__cxx11::string::~string((string *)local_78);
      }
      if ((ResDesc_00->ResourceType != SHADER_RESOURCE_TYPE_SAMPLER) ||
         (bVar3 = PipelineResourceAttribsVk::IsImmutableSamplerAssigned
                            ((PipelineResourceAttribsVk *)msg.field_2._8_8_), !bVar3)) {
        for (local_88 = 0; in_RCX = ResDesc_00, local_88 < ResDesc_00->ArraySize;
            local_88 = local_88 + 1) {
          UVar4 = PipelineResourceAttribsVk::CacheOffset
                            ((PipelineResourceAttribsVk *)msg.field_2._8_8_,CacheType);
          pRVar7 = ShaderResourceCacheVk::DescriptorSet::GetResource(this_01,UVar4 + local_88);
          _msg.field_2._8_8_ =
               Diligent::RefCntAutoPtr::operator_cast_to_IDeviceObject_
                         ((RefCntAutoPtr *)&pRVar7->pObject);
          if ((IDeviceObject *)_msg.field_2._8_8_ == (IDeviceObject *)0x0) {
            if (CacheType_00 == SRB) {
              GetShaderResourcePrintName<Diligent::PipelineResourceDesc>
                        ((String *)local_e0,ResDesc_00,local_88);
              FormatString<char[52],std::__cxx11::string,char[35],char_const*,char[3]>
                        ((string *)local_c0,
                         (Diligent *)"No resource is assigned to static shader variable \'",
                         (char (*) [52])local_e0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         "\' in pipeline resource signature \'",
                         (char (*) [35])
                         &(this->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>).
                          super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                          .m_Desc,(char **)"\'.",in_stack_fffffffffffffe38);
              std::__cxx11::string::~string((string *)local_e0);
              puVar2 = DebugMessageCallback;
              if (DebugMessageCallback != (undefined *)0x0) {
                uVar8 = std::__cxx11::string::c_str();
                (*(code *)puVar2)(2,uVar8,0);
              }
              std::__cxx11::string::~string((string *)local_c0);
            }
          }
          else {
            UVar4 = PipelineResourceAttribsVk::CacheOffset
                              ((PipelineResourceAttribsVk *)msg.field_2._8_8_,CacheType_00);
            msg_1.field_2._8_8_ =
                 ShaderResourceCacheVk::DescriptorSet::GetResource(this_02,UVar4 + local_88);
            if (pRVar7->Type != ((Resource *)msg_1.field_2._8_8_)->Type) {
              FormatString<char[26],char[39]>
                        ((string *)&pCachedResource,(Diligent *)"Debug expression failed:\n",
                         (char (*) [26])"SrcCachedRes.Type == DstCachedRes.Type",
                         (char (*) [39])msg_1.field_2._8_8_);
              pCVar6 = (Char *)std::__cxx11::string::c_str();
              DebugAssertionFailed
                        (pCVar6,"CopyStaticResources",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineResourceSignatureVkImpl.cpp"
                         ,0x23a);
              std::__cxx11::string::~string((string *)&pCachedResource);
            }
            msg_2.field_2._8_8_ =
                 Diligent::RefCntAutoPtr::operator_cast_to_IDeviceObject_
                           ((RefCntAutoPtr *)(msg_1.field_2._8_8_ + 8));
            if (msg_2.field_2._8_8_ != _msg.field_2._8_8_) {
              if ((IDeviceObject *)msg_2.field_2._8_8_ != (IDeviceObject *)0x0) {
                FormatString<char[111]>
                          ((string *)local_138,
                           (char (*) [111])
                           "Static resource has already been initialized, and the new resource does not match previously assigned resource"
                          );
                pCVar6 = (Char *)std::__cxx11::string::c_str();
                DebugAssertionFailed
                          (pCVar6,"CopyStaticResources",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineResourceSignatureVkImpl.cpp"
                           ,0x23f);
                std::__cxx11::string::~string((string *)local_138);
              }
              this_03 = DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                        ::GetDevice((DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                                     *)this);
              pLogicalDevice = RenderDeviceVkImpl::GetLogicalDevice(this_03);
              uVar1 = *(ushort *)msg.field_2._8_8_;
              RefCntAutoPtr<Diligent::IDeviceObject>::RefCntAutoPtr(&local_160,&pRVar7->pObject);
              ShaderResourceCacheVk::SetResourceInfo::SetResourceInfo
                        (&local_158,(uint)uVar1,local_88,&local_160,pRVar7->BufferBaseOffset,
                         pRVar7->BufferRangeSize);
              ShaderResourceCacheVk::SetResource
                        (DstResourceCache,pLogicalDevice,Index,UVar4 + local_88,&local_158);
              ShaderResourceCacheVk::SetResourceInfo::~SetResourceInfo(&local_158);
              RefCntAutoPtr<Diligent::IDeviceObject>::~RefCntAutoPtr(&local_160);
            }
          }
        }
      }
    }
    ShaderResourceCacheVk::DbgVerifyDynamicBuffersCounter(DstResourceCache);
  }
  return;
}

Assistant:

void PipelineResourceSignatureVkImpl::CopyStaticResources(ShaderResourceCacheVk& DstResourceCache) const
{
    if (!HasDescriptorSet(DESCRIPTOR_SET_ID_STATIC_MUTABLE) || m_pStaticResCache == nullptr)
        return;

    // SrcResourceCache contains only static resources.
    // In case of SRB, DstResourceCache contains static, mutable and dynamic resources.
    // In case of Signature, DstResourceCache contains only static resources.
    const auto& SrcResourceCache = *m_pStaticResCache;
    const auto  StaticSetIdx     = GetDescriptorSetIndex<DESCRIPTOR_SET_ID_STATIC_MUTABLE>();
    const auto& SrcDescrSet      = SrcResourceCache.GetDescriptorSet(StaticSetIdx);
    const auto& DstDescrSet      = const_cast<const ShaderResourceCacheVk&>(DstResourceCache).GetDescriptorSet(StaticSetIdx);
    const auto  ResIdxRange      = GetResourceIndexRange(SHADER_RESOURCE_VARIABLE_TYPE_STATIC);
    const auto  SrcCacheType     = SrcResourceCache.GetContentType();
    const auto  DstCacheType     = DstResourceCache.GetContentType();

    for (Uint32 r = ResIdxRange.first; r < ResIdxRange.second; ++r)
    {
        const auto& ResDesc = GetResourceDesc(r);
        const auto& Attr    = GetResourceAttribs(r);
        VERIFY_EXPR(ResDesc.VarType == SHADER_RESOURCE_VARIABLE_TYPE_STATIC);

        if (ResDesc.ResourceType == SHADER_RESOURCE_TYPE_SAMPLER && Attr.IsImmutableSamplerAssigned())
            continue; // Skip immutable separate samplers

        for (Uint32 ArrInd = 0; ArrInd < ResDesc.ArraySize; ++ArrInd)
        {
            const auto     SrcCacheOffset = Attr.CacheOffset(SrcCacheType) + ArrInd;
            const auto&    SrcCachedRes   = SrcDescrSet.GetResource(SrcCacheOffset);
            IDeviceObject* pObject        = SrcCachedRes.pObject;
            if (pObject == nullptr)
            {
                if (DstCacheType == ResourceCacheContentType::SRB)
                    LOG_ERROR_MESSAGE("No resource is assigned to static shader variable '", GetShaderResourcePrintName(ResDesc, ArrInd), "' in pipeline resource signature '", m_Desc.Name, "'.");
                continue;
            }

            const auto  DstCacheOffset = Attr.CacheOffset(DstCacheType) + ArrInd;
            const auto& DstCachedRes   = DstDescrSet.GetResource(DstCacheOffset);
            VERIFY_EXPR(SrcCachedRes.Type == DstCachedRes.Type);

            const IDeviceObject* pCachedResource = DstCachedRes.pObject;
            if (pCachedResource != pObject)
            {
                DEV_CHECK_ERR(pCachedResource == nullptr, "Static resource has already been initialized, and the new resource does not match previously assigned resource");
                DstResourceCache.SetResource(&GetDevice()->GetLogicalDevice(),
                                             StaticSetIdx,
                                             DstCacheOffset,
                                             {
                                                 Attr.BindingIndex,
                                                 ArrInd,
                                                 RefCntAutoPtr<IDeviceObject>{SrcCachedRes.pObject},
                                                 SrcCachedRes.BufferBaseOffset,
                                                 SrcCachedRes.BufferRangeSize //
                                             });
            }
        }
    }

#ifdef DILIGENT_DEBUG
    DstResourceCache.DbgVerifyDynamicBuffersCounter();
#endif
}